

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesPackageRedirect(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  cmValue this_01;
  bool bVar1;
  ulong uVar2;
  string *path;
  string local_a0;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string debugBuffer;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue redirectDir;
  cmSearchPath *paths;
  cmFindPackageCommand *this_local;
  
  redirectDir.Value =
       (string *)
       std::
       map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
       ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                    &PathLabel::PackageRedirect.super_PathLabel);
  this_00 = (this->super_cmFindCommon).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",&local_41);
  local_20 = cmMakefile::GetDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_20);
    uVar2 = std::__cxx11::string::empty();
    this_01 = redirectDir;
    if ((uVar2 & 1) == 0) {
      path = cmValue::operator*[abi_cxx11_(&local_20);
      cmSearchPath::AddPath((cmSearchPath *)this_01.Value,path);
    }
  }
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n",
               &local_79);
    std::allocator<char>::~allocator(&local_79);
    anon_unknown.dwarf_e82c04::collectPathsForDebug
              ((string *)local_78,(cmSearchPath *)redirectDir.Value,0);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              (&local_a0,&this->DebugBuffer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesPackageRedirect()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRedirect];

  const auto redirectDir =
    this->Makefile->GetDefinition("CMAKE_FIND_PACKAGE_REDIRECTS_DIR");
  if (redirectDir && !redirectDir->empty()) {
    paths.AddPath(*redirectDir);
  }
  if (this->DebugMode) {
    std::string debugBuffer =
      "The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}